

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestFieldOrderings_NestedMessage * __thiscall
proto2_unittest::TestFieldOrderings::_internal_mutable_optional_nested_message
          (TestFieldOrderings *this)

{
  TestFieldOrderings_NestedMessage *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.optional_nested_message_;
  if (pTVar1 != (TestFieldOrderings_NestedMessage *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestFieldOrderings_NestedMessage *)
           google::protobuf::Arena::
           DefaultConstruct<proto2_unittest::TestFieldOrderings_NestedMessage>(arena);
  (this->field_0)._impl_.optional_nested_message_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestFieldOrderings_NestedMessage* PROTOBUF_NONNULL TestFieldOrderings::_internal_mutable_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_nested_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestFieldOrderings_NestedMessage>(GetArena());
    _impl_.optional_nested_message_ = reinterpret_cast<::proto2_unittest::TestFieldOrderings_NestedMessage*>(p);
  }
  return _impl_.optional_nested_message_;
}